

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

void __thiscall
AnalyserExternalVariable_containsDependencyByName_Test::
~AnalyserExternalVariable_containsDependencyByName_Test
          (AnalyserExternalVariable_containsDependencyByName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    externalVariable->addDependency(model->component("membrane")->variable("Cm"));

    EXPECT_TRUE(externalVariable->containsDependency(model, "membrane", "Cm"));
    EXPECT_FALSE(externalVariable->containsDependency(model, "membrane", "X"));
}